

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SimpleTypeHandler.cpp
# Opt level: O2

uint32 __thiscall
Js::SimpleTypeHandler<6UL>::ExtractSlotInfo_TTD
          (SimpleTypeHandler<6UL> *this,SnapHandlerPropertyEntry *entryInfo,
          ThreadContext *threadContext,SlabAllocator *alloc)

{
  uint uVar1;
  long lVar2;
  
  uVar1 = this->propertyCount;
  for (lVar2 = 0; (ulong)uVar1 << 3 != lVar2; lVar2 = lVar2 + 8) {
    TTD::NSSnapType::ExtractSnapPropertyEntryInfo
              ((SnapHandlerPropertyEntry *)((long)&entryInfo->PropertyRecordId + lVar2),
               *(PropertyId *)(*(long *)((long)&this->descriptors[0].Id.ptr + lVar2 * 2) + 8),
               *(PropertyAttributes *)((long)&this->descriptors[0].field_1 + lVar2 * 2),Data);
  }
  return uVar1;
}

Assistant:

uint32 SimpleTypeHandler<size>::ExtractSlotInfo_TTD(TTD::NSSnapType::SnapHandlerPropertyEntry* entryInfo, ThreadContext* threadContext, TTD::SlabAllocator& alloc) const
    {
        uint32 plength = this->propertyCount;

        for(uint32 index = 0; index < plength; ++index)
        {
            TTD::NSSnapType::ExtractSnapPropertyEntryInfo(entryInfo + index, this->descriptors[index].Id->GetPropertyId(), this->descriptors[index].Attributes, TTD::NSSnapType::SnapEntryDataKindTag::Data);
        }

        return plength;
    }